

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O2

bool __thiscall
Assimp::glTF2Importer::CanRead(glTF2Importer *this,string *pFile,IOSystem *pIOHandler,bool param_3)

{
  bool bVar1;
  bool bVar2;
  string version;
  Asset asset;
  string local_a70;
  char *local_a50;
  long local_a48;
  undefined1 local_a30 [2576];
  
  BaseImporter::GetExtension(&local_a70,pFile);
  bVar1 = std::operator!=(&local_a70,"gltf");
  if (bVar1) {
    bVar2 = std::operator!=(&local_a70,"glb");
    bVar1 = false;
    if ((pIOHandler == (IOSystem *)0x0) || (bVar2)) goto LAB_00543b46;
  }
  else if (pIOHandler == (IOSystem *)0x0) {
    bVar1 = false;
    goto LAB_00543b46;
  }
  glTF2::Asset::Asset((Asset *)local_a30,pIOHandler);
  bVar1 = std::operator==(&local_a70,"glb");
  glTF2::Asset::Load((Asset *)local_a30,pFile,bVar1);
  std::__cxx11::string::string((string *)&local_a50,(string *)(local_a30 + 0x120));
  if (local_a48 == 0) {
    bVar1 = false;
  }
  else {
    bVar1 = *local_a50 == '2';
  }
  std::__cxx11::string::~string((string *)&local_a50);
  glTF2::Asset::~Asset((Asset *)local_a30);
LAB_00543b46:
  std::__cxx11::string::~string((string *)&local_a70);
  return bVar1;
}

Assistant:

bool glTF2Importer::CanRead(const std::string& pFile, IOSystem* pIOHandler, bool /* checkSig */) const
{
    const std::string &extension = GetExtension(pFile);

    if (extension != "gltf" && extension != "glb")
        return false;

    if (pIOHandler) {
        glTF2::Asset asset(pIOHandler);
        asset.Load(pFile, extension == "glb");
        std::string version = asset.asset.version;
        return !version.empty() && version[0] == '2';
    }

    return false;
}